

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceTests.cpp
# Opt level: O1

int testMultiFunctionAllowed(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong uVar2;
  Rep *pRVar3;
  ModelDescription *interface;
  bool bVar4;
  ResultType RVar5;
  FunctionDescription *obj;
  void *pvVar6;
  ostream *poVar7;
  undefined8 *puVar8;
  int iVar9;
  Arena *arena;
  ValidationPolicy validationPolicy;
  Model m;
  ValidationPolicy local_74;
  Result local_70;
  Model local_48;
  
  CoreML::Specification::Model::Model(&local_48,(Arena *)0x0,false);
  local_74.allowsEmptyInput = true;
  local_74.allowsEmptyOutput = true;
  local_74.allowsMultipleFunctions = true;
  local_74.allowsStatefulPrediction = false;
  if (local_48.description_ == (ModelDescription *)0x0) {
    arena = (Arena *)(local_48.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((local_48.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      arena = *(Arena **)arena;
    }
    local_48.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>(arena)
    ;
  }
  interface = local_48.description_;
  uVar2 = ((local_48.description_)->super_MessageLite)._internal_metadata_.ptr_;
  puVar8 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
  if ((uVar2 & 1) != 0) {
    puVar8 = (undefined8 *)*puVar8;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            (&(local_48.description_)->defaultfunctionname_,"foo",puVar8);
  pRVar3 = (interface->functions_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_0016be11:
    obj = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FunctionDescription>
                    ((interface->functions_).super_RepeatedPtrFieldBase.arena_);
    pvVar6 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                       (&(interface->functions_).super_RepeatedPtrFieldBase,obj);
  }
  else {
    iVar9 = (interface->functions_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar3->allocated_size <= iVar9) goto LAB_0016be11;
    (interface->functions_).super_RepeatedPtrFieldBase.current_size_ = iVar9 + 1;
    pvVar6 = pRVar3->elements[iVar9];
  }
  puVar8 = (undefined8 *)(*(ulong *)((long)pvVar6 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar6 + 8) & 1) != 0) {
    puVar8 = (undefined8 *)*puVar8;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar6 + 0x58),"foo",puVar8);
  CoreML::validateModelDescription(&local_70,interface,9,&local_74);
  bVar4 = CoreML::Result::good(&local_70);
  paVar1 = &local_70.m_message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_70.m_message._M_dataplus._M_p,
                    local_70.m_message.field_2._M_allocated_capacity + 1);
  }
  if (bVar4) {
    local_74.allowsMultipleFunctions = false;
    CoreML::validateModelDescription(&local_70,interface,9,&local_74);
    bVar4 = CoreML::Result::good(&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_70.m_message._M_dataplus._M_p,
                      local_70.m_message.field_2._M_allocated_capacity + 1);
    }
    if (bVar4) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/InterfaceTests.cpp"
                 ,0x66);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x18b);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,": error: ",9);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,
                 "!(((validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS18, validationPolicy))).good())"
                 ,0x6b);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," was false, expected true.",0x1a);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    }
    else {
      CoreML::validateModelDescription(&local_70,interface,9,&local_74);
      RVar5 = CoreML::Result::type(&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70.m_message._M_dataplus._M_p != paVar1) {
        operator_delete(local_70.m_message._M_dataplus._M_p,
                        local_70.m_message.field_2._M_allocated_capacity + 1);
      }
      iVar9 = 0;
      if (RVar5 == MODEL_TYPE_DOES_NOT_SUPPORT_MULTI_FUNCTION) goto LAB_0016c021;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/InterfaceTests.cpp"
                 ,0x66);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x18b);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,": error: ",9);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,
                 "((ResultType::MODEL_TYPE_DOES_NOT_SUPPORT_MULTI_FUNCTION)) == ((validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS18, validationPolicy)).type())"
                 ,0xa6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," was false, expected true.",0x1a);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/InterfaceTests.cpp"
               ,0x66);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x188);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,
               "(validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS18, validationPolicy)).good()"
               ,0x66);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  }
  std::ostream::put((char)poVar7);
  iVar9 = 1;
  std::ostream::flush();
LAB_0016c021:
  CoreML::Specification::Model::~Model(&local_48);
  return iVar9;
}

Assistant:

int testMultiFunctionAllowed() {
    Specification::Model m;

    auto validationPolicy = ValidationPolicy();
    validationPolicy.allowsEmptyInput = true;
    validationPolicy.allowsEmptyOutput = true;
    validationPolicy.allowsMultipleFunctions = true;

    auto *description = m.mutable_description();
    description->set_defaultfunctionname("foo");
    auto *function = description->add_functions();
    function->set_name("foo");

    ML_ASSERT_GOOD(validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS18, validationPolicy));

    validationPolicy.allowsMultipleFunctions = false;
    ML_ASSERT_BAD_WITH_TYPE(validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS18, validationPolicy), ResultType::MODEL_TYPE_DOES_NOT_SUPPORT_MULTI_FUNCTION);

    return 0;
}